

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::replace
          (QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype i,
          parameter_type t)

{
  _func_QVariant_void_ptr_void_ptr_double **pp_Var1;
  _func_QVariant_void_ptr_void_ptr_double *in_RDX;
  long in_RSI;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_RDI;
  long in_FS_OFFSET;
  DataPointer oldData;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_stack_ffffffffffffff88;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_stack_ffffffffffffff90;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (_func_QVariant_void_ptr_void_ptr_double **)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::QArrayDataPointer(&local_28);
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::detach
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pp_Var1 = QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::data(in_RDI);
  pp_Var1[in_RSI] = in_RDX;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::~QArrayDataPointer
            (in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, parameter_type t)
    {
        Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
        DataPointer oldData;
        d.detach(&oldData);
        d.data()[i] = t;
    }